

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

ssize_t __thiscall
kj::ReadableDirectory::readlink(ReadableDirectory *this,char *__path,char *__buf,size_t __len)

{
  NullableValue<kj::String> *other;
  String *pSVar1;
  char (*params) [2];
  Fault local_a0;
  Fault f;
  String *p;
  Maybe<kj::String> local_68;
  undefined1 local_48 [8];
  NullableValue<kj::String> _p570;
  ReadableDirectory *this_local;
  PathPtr path_local;
  
  _p570.field_1.value.content.disposer = (ArrayDisposer *)__path;
  this_local = (ReadableDirectory *)__buf;
  path_local.parts.ptr = (String *)__len;
  path_local.parts.size_ = (size_t)this;
  (**(code **)(*(long *)__path + 0x60))(&local_68,__path,__buf,__len);
  other = kj::_::readMaybe<kj::String>(&local_68);
  kj::_::NullableValue<kj::String>::NullableValue((NullableValue<kj::String> *)local_48,other);
  Maybe<kj::String>::~Maybe(&local_68);
  pSVar1 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_48);
  if (pSVar1 == (String *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14],kj::PathPtr&>
              (&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x23d,FAILED,(char *)0x0,"\"not a symlink\", path",(char (*) [14])"not a symlink",
               (PathPtr *)&this_local);
    f.exception._4_4_ = 2;
    kj::_::Debug::Fault::~Fault(&local_a0);
    str<char_const(&)[2]>((String *)this,(kj *)0x39b444,params);
  }
  else {
    pSVar1 = kj::_::NullableValue<kj::String>::operator*((NullableValue<kj::String> *)local_48);
    pSVar1 = mv<kj::String>(pSVar1);
    String::String((String *)this,pSVar1);
  }
  f.exception._4_4_ = 1;
  kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_48);
  return (ssize_t)this;
}

Assistant:

String ReadableDirectory::readlink(PathPtr path) const {
  KJ_IF_SOME(p, tryReadlink(path)) {
    return kj::mv(p);
  } else {
    KJ_FAIL_REQUIRE("not a symlink", path) { break; }